

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::splat<(wasm::Type::BasicType)2,8>(Literal *__return_storage_ptr__,wasm *this,Literal *val)

{
  bool bVar1;
  undefined1 local_e0 [8];
  LaneArray<8> lanes;
  Literal *val_local;
  
  lanes._M_elems[7].type.id._4_4_ = 2;
  bVar1 = Type::operator==((Type *)(this + 0x10),(BasicType *)((long)&lanes._M_elems[7].type.id + 4)
                          );
  if (!bVar1) {
    __assert_fail("val.type == Ty",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                  ,0x71a,"Literal wasm::splat(const Literal &) [Ty = wasm::Type::i32, Lanes = 8]");
  }
  std::array<wasm::Literal,_8UL>::array((array<wasm::Literal,_8UL> *)local_e0);
  std::array<wasm::Literal,_8UL>::fill((array<wasm::Literal,_8UL> *)local_e0,(value_type *)this);
  Literal::Literal(__return_storage_ptr__,(LaneArray<8> *)local_e0);
  std::array<wasm::Literal,_8UL>::~array((array<wasm::Literal,_8UL> *)local_e0);
  return __return_storage_ptr__;
}

Assistant:

static Literal splat(const Literal& val) {
  assert(val.type == Ty);
  LaneArray<Lanes> lanes;
  lanes.fill(val);
  return Literal(lanes);
}